

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_sampler * llama_sampler_init_dist(uint32_t seed)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  llama_sampler *plVar4;
  ulong uVar5;
  
  uVar1 = get_rng_seed(seed);
  puVar2 = (uint32_t *)operator_new(0x1390);
  *puVar2 = seed;
  puVar2[1] = uVar1;
  uVar5 = (ulong)uVar1;
  *(ulong *)(puVar2 + 2) = uVar5;
  lVar3 = 2;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3) - 1);
    *(ulong *)(puVar2 + lVar3 * 2) = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x271);
  puVar2[0x4e2] = 0x270;
  puVar2[0x4e3] = 0;
  plVar4 = (llama_sampler *)operator_new(0x10);
  plVar4->iface = &llama_sampler_dist_i;
  plVar4->ctx = puVar2;
  return plVar4;
}

Assistant:

struct llama_sampler * llama_sampler_init_dist(uint32_t seed) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dist_i,
        /* .ctx   = */ new llama_sampler_dist {
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}